

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_tests.cpp
# Opt level: O2

void anon_unknown.dwarf_642426::CheckInferDescriptor
               (string *script_hex,string *expected_desc,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *hex_scripts,
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *origin_pubkeys)

{
  char cVar1;
  pointer pbVar2;
  pointer ppVar3;
  size_type sVar4;
  long lVar5;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  bool bVar6;
  long lVar7;
  pointer pbVar8;
  iterator in_R8;
  iterator in_R9;
  long lVar9;
  uint uVar10;
  pointer ppVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  const_string msg;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  string_view hex_str_02;
  const_string file;
  string_view separators;
  string_view str;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fpr_bytes;
  Span<const_char> origin_sp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_bytes;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> origin_split;
  string checksum;
  KeyOriginInfo local_210;
  uint32_t p;
  string fpr_str;
  KeyOriginInfo info;
  vector<unsigned_char,_std::allocator<unsigned_char>_> prov_script_bytes;
  FlatSigningProvider provider;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  hex_str._M_str = (script_hex->_M_dataplus)._M_p;
  hex_str._M_len = script_hex->_M_string_length;
  ParseHex<unsigned_char>(&script_bytes,hex_str);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::
  prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            (&local_58,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
  provider.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FlatSigningProvider_0114ae68;
  provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  provider.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &provider.origins._M_t._M_impl.super__Rb_tree_header._M_header;
  provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  provider.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &provider.keys._M_t._M_impl.super__Rb_tree_header._M_header;
  provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  provider.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header;
  provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pbVar2 = (hex_scripts->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pbVar8 = (hex_scripts->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar2; pbVar8 = pbVar8 + 1) {
    hex_str_00._M_str = (pbVar8->_M_dataplus)._M_p;
    hex_str_00._M_len = pbVar8->_M_string_length;
    ParseHex<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &prov_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
               hex_str_00);
    last._M_current._1_7_ =
         prov_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_finish._1_7_;
    last._M_current._0_1_ =
         prov_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_finish._0_1_;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::
    prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&checksum,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )prov_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_start,last);
    CScriptID::CScriptID((CScriptID *)&info,(CScript *)&checksum);
    std::
    _Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
    ::_M_emplace_unique<CScriptID,CScript_const&>
              ((_Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
                *)&provider.scripts,(CScriptID *)&info,(CScript *)&checksum);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&checksum);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&prov_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
    ;
  }
  ppVar11 = (origin_pubkeys->
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (origin_pubkeys->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppVar11 == ppVar3) {
      GetDescriptorChecksum(&checksum,expected_desc);
      InferDescriptor((CScript *)&fpr_bytes,(SigningProvider *)&local_58);
      local_2c8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_2c0 = "";
      local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      file.m_end = (iterator)0x1de;
      file.m_begin = (iterator)&local_2c8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2d8,msg)
      ;
      prov_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = 0;
      prov_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "<W\x1b";
      prov_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
      local_2e8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_2e0 = "";
      (**(code **)(*(long *)fpr_bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 0x20))
                (&info,fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &origin_split,expected_desc,"#");
      std::operator+(&fpr_str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &origin_split,&checksum);
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                (&prov_script_bytes,&local_2e8,0x1de,1,2,&info,"desc->ToString()",&fpr_str,
                 "expected_desc + \"#\" + checksum");
      std::__cxx11::string::~string((string *)&fpr_str);
      std::__cxx11::string::~string((string *)&origin_split);
      std::__cxx11::string::~string((string *)&info);
      if (fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)fpr_bytes.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
      std::__cxx11::string::~string((string *)&checksum);
      FlatSigningProvider::~FlatSigningProvider(&provider);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_58);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    hex_str_01._M_str = (ppVar11->first)._M_dataplus._M_p;
    hex_str_01._M_len = (ppVar11->first)._M_string_length;
    ParseHex<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&checksum,hex_str_01);
    CPubKey::Set<unsigned_char_const*>
              ((CPubKey *)&prov_script_bytes,(uchar *)checksum._M_dataplus._M_p,
               (uchar *)checksum._M_string_length);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&checksum);
    CPubKey::GetID((CKeyID *)&checksum,(CPubKey *)&prov_script_bytes);
    std::
    _Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
    ::_M_emplace_unique<CKeyID,CPubKey&>
              ((_Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
                *)&provider.pubkeys,(CKeyID *)&checksum,(CPubKey *)&prov_script_bytes);
    sVar4 = (ppVar11->second)._M_string_length;
    if (sVar4 != 0) {
      info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      origin_sp.m_data = (ppVar11->second)._M_dataplus._M_p;
      separators._M_str = in_R8;
      separators._M_len = (size_t)"/";
      origin_sp.m_size = sVar4;
      util::Split<Span<char_const>>
                (&origin_split,(util *)&origin_sp,(Span<const_char> *)&DAT_00000001,separators);
      fpr_str._M_dataplus._M_p = (pointer)&fpr_str.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&fpr_str,
                 (origin_split.
                  super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
                  super__Vector_impl_data._M_start)->m_data,
                 (origin_split.
                  super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
                  super__Vector_impl_data._M_start)->m_data +
                 (origin_split.
                  super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
                  super__Vector_impl_data._M_start)->m_size);
      hex_str_02._M_str = fpr_str._M_dataplus._M_p;
      hex_str_02._M_len = fpr_str._M_string_length;
      ParseHex<unsigned_char>(&fpr_bytes,hex_str_02);
      if ((long)fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        memmove(&info,fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                (long)fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
      }
      lVar9 = 0x18;
      uVar12 = 1;
      while( true ) {
        if ((ulong)((long)origin_split.
                          super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)origin_split.
                          super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 4) <= uVar12) break;
        lVar5 = *(long *)((long)origin_split.
                                super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar9 + -8);
        lVar7 = *(long *)((long)&(origin_split.
                                  super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar9);
        uVar10 = 0;
        if (lVar7 == 0) {
          lVar7 = 0;
        }
        else {
          cVar1 = *(char *)(lVar5 + -1 + lVar7);
          if ((cVar1 == 'h') || (uVar10 = 0, cVar1 == '\'')) {
            lVar7 = lVar7 + -1;
            uVar10 = 0x80000000;
          }
        }
        checksum._M_dataplus._M_p = (pointer)&checksum.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&checksum,lVar5,lVar7 + lVar5);
        str._M_str = checksum._M_dataplus._M_p;
        str._M_len = checksum._M_string_length;
        bVar6 = ParseUInt32(str,&p);
        if (!bVar6) {
          __assert_fail("ParseUInt32(std::string(elem.begin(), elem.end()), &p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                        ,0x1d3,
                        "void (anonymous namespace)::CheckInferDescriptor(const std::string &, const std::string &, const std::vector<std::string> &, const std::vector<std::pair<std::string, std::string>> &)"
                       );
        }
        std::__cxx11::string::~string((string *)&checksum);
        checksum._M_dataplus._M_p._0_4_ = uVar10 | p;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&info.path,(uint *)&checksum);
        uVar12 = uVar12 + 1;
        lVar9 = lVar9 + 0x10;
      }
      CPubKey::GetID((CKeyID *)&p,(CPubKey *)&prov_script_bytes);
      memcpy((pair<CPubKey,_KeyOriginInfo> *)&checksum,(CPubKey *)&prov_script_bytes,0x41);
      KeyOriginInfo::KeyOriginInfo(&local_210,&info);
      std::
      _Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>
      ::_M_emplace_unique<CKeyID,std::pair<CPubKey,KeyOriginInfo>>
                ((_Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>
                  *)&provider.origins,(CKeyID *)&p,(pair<CPubKey,_KeyOriginInfo> *)&checksum);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&local_210.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::__cxx11::string::~string((string *)&fpr_str);
      std::_Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>::~_Vector_base
                (&origin_split.
                  super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    }
    ppVar11 = ppVar11 + 1;
  } while( true );
}

Assistant:

void CheckInferDescriptor(const std::string& script_hex, const std::string& expected_desc, const std::vector<std::string>& hex_scripts, const std::vector<std::pair<std::string, std::string>>& origin_pubkeys)
{
    std::vector<unsigned char> script_bytes{ParseHex(script_hex)};
    const CScript& script{script_bytes.begin(), script_bytes.end()};

    FlatSigningProvider provider;
    for (const std::string& prov_script_hex : hex_scripts) {
        std::vector<unsigned char> prov_script_bytes{ParseHex(prov_script_hex)};
        const CScript& prov_script{prov_script_bytes.begin(), prov_script_bytes.end()};
        provider.scripts.emplace(CScriptID(prov_script), prov_script);
    }
    for (const auto& [pubkey_hex, origin_str] : origin_pubkeys) {
        CPubKey origin_pubkey{ParseHex(pubkey_hex)};
        provider.pubkeys.emplace(origin_pubkey.GetID(), origin_pubkey);

        if (!origin_str.empty()) {
            KeyOriginInfo info;
            Span<const char> origin_sp{origin_str};
            std::vector<Span<const char>> origin_split = Split(origin_sp, "/");
            std::string fpr_str(origin_split[0].begin(), origin_split[0].end());
            auto fpr_bytes = ParseHex(fpr_str);
            std::copy(fpr_bytes.begin(), fpr_bytes.end(), info.fingerprint);
            for (size_t i = 1; i < origin_split.size(); ++i) {
                Span<const char> elem = origin_split[i];
                bool hardened = false;
                if (elem.size() > 0) {
                    const char last = elem[elem.size() - 1];
                    if (last == '\'' || last == 'h') {
                        elem = elem.first(elem.size() - 1);
                        hardened = true;
                    }
                }
                uint32_t p;
                assert(ParseUInt32(std::string(elem.begin(), elem.end()), &p));
                info.path.push_back(p | (((uint32_t)hardened) << 31));
            }

            provider.origins.emplace(origin_pubkey.GetID(), std::make_pair(origin_pubkey, info));
        }
    }

    std::string checksum{GetDescriptorChecksum(expected_desc)};

    std::unique_ptr<Descriptor> desc = InferDescriptor(script, provider);
    BOOST_CHECK_EQUAL(desc->ToString(), expected_desc + "#" + checksum);
}